

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void operator_suite::addition_assignment(void)

{
  initializer_list<int> input;
  iterator iVar1;
  difference_type local_90;
  iterator local_88;
  undefined4 local_6c;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_88.current = 0x2c00000021;
  local_88.parent = (view_pointer)0x160000000b;
  input._M_len = 4;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,0);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x33b,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x33e,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,2);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x341,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x344,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,0);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x34a,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x34d,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,2);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x350,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x353,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x42);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,0);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x359,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x35c,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,2);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x35f,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x362,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x4d);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,0);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x368,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x36b,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,2);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x36e,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x371,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x58);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,0);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x377,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x37a,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,2);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x37d,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_88,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,local_88.parent,local_88.current);
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x380,"void operator_suite::addition_assignment()",&local_90,&local_6c);
  return;
}

Assistant:

void addition_assignment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(55);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(66);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(77);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(88);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
}